

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O2

int IsValidExtendedFormat(WebPDemuxer *dmux)

{
  int *piVar1;
  WebPDemuxState WVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Frame *pFVar8;
  int iVar9;
  
  WVar2 = dmux->state_;
  iVar7 = 1;
  if (WVar2 != WEBP_DEMUX_PARSING_HEADER) {
    iVar7 = dmux->canvas_width_;
    if (((0 < iVar7) && (iVar3 = dmux->canvas_height_, 0 < iVar3)) && (-1 < dmux->loop_count_)) {
      uVar4 = dmux->feature_flags_;
      pFVar8 = dmux->frames_;
      if ((uVar4 & 0xffffffc1) == 0 && (pFVar8 != (Frame *)0x0 || WVar2 != WEBP_DEMUX_DONE)) {
        do {
          if (pFVar8 == (Frame *)0x0) {
            return 1;
          }
          piVar1 = &pFVar8->frame_num_;
          for (; (pFVar8 != (Frame *)0x0 && (pFVar8->frame_num_ == *piVar1)); pFVar8 = pFVar8->next_
              ) {
            if (1 < *piVar1 && (uVar4 & 2) == 0) {
              return 0;
            }
            if (pFVar8->complete_ == 0) {
              if (WVar2 == WEBP_DEMUX_DONE) {
                return 0;
              }
              if (((pFVar8->img_components_[1].size_ != 0) &&
                  (pFVar8->img_components_[0].size_ != 0)) &&
                 (pFVar8->img_components_[0].offset_ < pFVar8->img_components_[1].offset_)) {
                return 0;
              }
              if (pFVar8->next_ != (Frame *)0x0) {
                return 0;
              }
              iVar9 = pFVar8->width_;
              if (0 < iVar9) goto LAB_00107085;
            }
            else {
              if (pFVar8->img_components_[1].size_ == 0) {
                if (pFVar8->img_components_[0].size_ == 0) {
                  return 0;
                }
              }
              else if (pFVar8->img_components_[0].offset_ < pFVar8->img_components_[1].offset_) {
                return 0;
              }
              iVar9 = pFVar8->width_;
              if (iVar9 < 1) {
                return 0;
              }
              if (pFVar8->height_ < 1) {
                return 0;
              }
LAB_00107085:
              iVar5 = pFVar8->height_;
              if (0 < iVar5) {
                iVar6 = pFVar8->x_offset_;
                if ((uVar4 & 2) == 0) {
                  if ((((iVar6 != 0) || (iVar5 != iVar3)) || (iVar9 != iVar7)) ||
                     (pFVar8->y_offset_ != 0)) {
                    return 0;
                  }
                }
                else {
                  if (iVar6 < 0) {
                    return 0;
                  }
                  if (pFVar8->y_offset_ < 0) {
                    return 0;
                  }
                  if (iVar7 < iVar6 + iVar9) {
                    return 0;
                  }
                  if (iVar3 < pFVar8->y_offset_ + iVar5) {
                    return 0;
                  }
                }
              }
            }
          }
        } while( true );
      }
    }
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

static int IsValidExtendedFormat(const WebPDemuxer* const dmux) {
  const int is_animation = !!(dmux->feature_flags_ & ANIMATION_FLAG);
  const Frame* f = dmux->frames_;

  if (dmux->state_ == WEBP_DEMUX_PARSING_HEADER) return 1;

  if (dmux->canvas_width_ <= 0 || dmux->canvas_height_ <= 0) return 0;
  if (dmux->loop_count_ < 0) return 0;
  if (dmux->state_ == WEBP_DEMUX_DONE && dmux->frames_ == NULL) return 0;
  if (dmux->feature_flags_ & ~ALL_VALID_FLAGS) return 0;  // invalid bitstream

  while (f != NULL) {
    const int cur_frame_set = f->frame_num_;

    // Check frame properties.
    for (; f != NULL && f->frame_num_ == cur_frame_set; f = f->next_) {
      const ChunkData* const image = f->img_components_;
      const ChunkData* const alpha = f->img_components_ + 1;

      if (!is_animation && f->frame_num_ > 1) return 0;

      if (f->complete_) {
        if (alpha->size_ == 0 && image->size_ == 0) return 0;
        // Ensure alpha precedes image bitstream.
        if (alpha->size_ > 0 && alpha->offset_ > image->offset_) {
          return 0;
        }

        if (f->width_ <= 0 || f->height_ <= 0) return 0;
      } else {
        // There shouldn't be a partial frame in a complete file.
        if (dmux->state_ == WEBP_DEMUX_DONE) return 0;

        // Ensure alpha precedes image bitstream.
        if (alpha->size_ > 0 && image->size_ > 0 &&
            alpha->offset_ > image->offset_) {
          return 0;
        }
        // There shouldn't be any frames after an incomplete one.
        if (f->next_ != NULL) return 0;
      }

      if (f->width_ > 0 && f->height_ > 0 &&
          !CheckFrameBounds(f, !is_animation,
                            dmux->canvas_width_, dmux->canvas_height_)) {
        return 0;
      }
    }
  }
  return 1;
}